

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FastSet.h
# Opt level: O0

CFastSet<int> * __thiscall CFastSet<int>::operator+=(CFastSet<int> *this,CFastSet<int> *set)

{
  size_t *psVar1;
  iterator __first1;
  iterator __last1;
  iterator __first2;
  iterator __last2;
  iterator __i;
  insert_iterator<std::set<int,_std::less<int>,_std::allocator<int>_>_> __result;
  undefined1 local_b8 [8];
  CSet result;
  CSet b;
  undefined1 local_48 [8];
  CSet a;
  CFastSet<int> *set_local;
  CFastSet<int> *this_local;
  
  a._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)set;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)local_48);
  GetSet(this,(set<int,_std::less<int>,_std::allocator<int>_> *)local_48);
  psVar1 = &result._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)psVar1);
  GetSet((CFastSet<int> *)a._M_t._M_impl.super__Rb_tree_header._M_node_count,(CSet *)psVar1);
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)local_b8);
  __first1 = std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                       ((set<int,_std::less<int>,_std::allocator<int>_> *)local_48);
  __last1 = std::set<int,_std::less<int>,_std::allocator<int>_>::end
                      ((set<int,_std::less<int>,_std::allocator<int>_> *)local_48);
  psVar1 = &result._M_t._M_impl.super__Rb_tree_header._M_node_count;
  __first2 = std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                       ((set<int,_std::less<int>,_std::allocator<int>_> *)psVar1);
  __last2 = std::set<int,_std::less<int>,_std::allocator<int>_>::end
                      ((set<int,_std::less<int>,_std::allocator<int>_> *)psVar1);
  __i = std::set<int,_std::less<int>,_std::allocator<int>_>::end
                  ((set<int,_std::less<int>,_std::allocator<int>_> *)local_b8);
  __result = std::inserter<std::set<int,std::less<int>,std::allocator<int>>>
                       ((set<int,_std::less<int>,_std::allocator<int>_> *)local_b8,__i);
  std::
  set_union<std::_Rb_tree_const_iterator<int>,std::_Rb_tree_const_iterator<int>,std::insert_iterator<std::set<int,std::less<int>,std::allocator<int>>>>
            ((_Rb_tree_const_iterator<int>)__first1._M_node,
             (_Rb_tree_const_iterator<int>)__last1._M_node,
             (_Rb_tree_const_iterator<int>)__first2._M_node,
             (_Rb_tree_const_iterator<int>)__last2._M_node,__result);
  operator=(this,(CSet *)local_b8);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)local_b8);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)
             &result._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)local_48);
  return this;
}

Assistant:

CFastSet<T>& CFastSet<T>::operator+=(const CFastSet& set)
{
	CSet a;
	GetSet( &a );
	CSet b;
	set.GetSet( &b );
	CSet result;

	std::set_union( a.begin(), a.end(), b.begin(), b.end(),
		std::inserter( result, result.end() ) );

	*this = result;

	return *this;
}